

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

bool __thiscall CBlockPolicyEstimator::Read(CBlockPolicyEstimator *this,AutoFile *filein)

{
  vector<double,_std::allocator<double>_> *defaultBuckets;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_00;
  long lVar1;
  pointer pdVar2;
  string_view source_file;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Logger *pLVar8;
  __uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true> _Var9;
  mapped_type_conflict *pmVar10;
  runtime_error *prVar11;
  int nFileVersion;
  int nFileVersion_00;
  int nFileVersion_01;
  uint i;
  ulong uVar12;
  int *args_1;
  size_t numBuckets;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int nVersionRequired;
  undefined8 local_f8;
  char *pcStack_f0;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileLongStats;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileShortStats;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileFeeStats;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (int *)0x3dc;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock7,&this->m_cs_fee_estimator,"m_cs_fee_estimator",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
             ,0x3dc,false);
  nVersionRequired = ser_readdata32<AutoFile>(filein);
  ser_readdata32<AutoFile>(filein);
  if (0x46c6c < nVersionRequired) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<int>(&log_msg,"up-version (%d) fee estimate file",&nVersionRequired);
    std::runtime_error::runtime_error(prVar11,(string *)&log_msg);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_007c38d4;
  }
  uVar5 = ser_readdata32<AutoFile>(filein);
  if (nVersionRequired < 0x2498c) {
    pLVar8 = LogInstance();
    bVar4 = BCLog::Logger::Enabled(pLVar8);
    if (bVar4) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_allocated_capacity =
           log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      tinyformat::format<char[5],int>
                ((string *)&fileFeeStats,
                 (tinyformat *)"%s: incompatible old fee estimation data (non-fatal). Version: %d\n"
                 ,"Read",(char (*) [5])&nVersionRequired,args_1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &fileFeeStats);
      std::__cxx11::string::~string((string *)&fileFeeStats);
      pLVar8 = LogInstance();
      local_f8 = 0x58;
      pcStack_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp";
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "Read";
      logging_function._M_len = 4;
      BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x3e9,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  else {
    uVar6 = ser_readdata32<AutoFile>(filein);
    uVar7 = ser_readdata32<AutoFile>(filein);
    if ((uVar7 < uVar6) || (uVar5 < uVar7)) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar11,"Corrupt estimates file. Historical block range for estimates is invalid");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_007c38d4;
    }
    fileFeeStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)&log_msg;
    log_msg.field_2._M_allocated_capacity = 0;
    log_msg._M_dataplus._M_p = (pointer)0x0;
    log_msg._M_string_length = 0;
    AutoFile::operator>>
              (filein,(Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_std::vector<double,_std::allocator<double>_>_&>
                       *)&fileFeeStats);
    numBuckets = (long)(log_msg._M_string_length - (long)log_msg._M_dataplus._M_p) >> 3;
    if (numBuckets - 0x3e9 < 0xfffffffffffffc19) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar11,"Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_007c38d4;
    }
    _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)operator_new(0xb0);
    defaultBuckets = &this->buckets;
    this_00 = &this->bucketMap;
    TxConfirmStats::TxConfirmStats
              ((TxConfirmStats *)
               _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
               _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,defaultBuckets,this_00,
               0x18,0.9952,2);
    fileFeeStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              ((TxConfirmStats *)
               _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
               _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,defaultBuckets,this_00,
               0xc,0.962,1);
    fileShortStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              ((TxConfirmStats *)
               _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
               _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,defaultBuckets,this_00,
               0x2a,0.99931,0x18);
    fileLongStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         _Var9.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    TxConfirmStats::Read
              ((TxConfirmStats *)
               fileFeeStats._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,filein,nFileVersion,
               numBuckets);
    TxConfirmStats::Read
              ((TxConfirmStats *)
               fileShortStats._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,filein,nFileVersion_00,
               numBuckets);
    TxConfirmStats::Read
              ((TxConfirmStats *)
               fileLongStats._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,filein,nFileVersion_01,
               numBuckets);
    std::vector<double,_std::allocator<double>_>::operator=
              (defaultBuckets,(vector<double,_std::allocator<double>_> *)&log_msg);
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
    ::clear(&this_00->_M_t);
    uVar12 = 0;
    while( true ) {
      uVar3._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
      super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
      super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
           fileFeeStats._M_t.
           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
           super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
      pdVar2 = (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= uVar12) break;
      pmVar10 = std::
                map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                ::operator[](this_00,pdVar2 + uVar12);
      *pmVar10 = (mapped_type_conflict)uVar12;
      uVar12 = (ulong)((mapped_type_conflict)uVar12 + 1);
    }
    fileFeeStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0;
    std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
              ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               &this->feeStats,
               (pointer)uVar3._M_t.
                        super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                        .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    uVar3 = fileShortStats;
    fileShortStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0;
    std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
              ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               &this->shortStats,
               (pointer)uVar3._M_t.
                        super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                        .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    uVar3 = fileLongStats;
    fileLongStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0;
    std::__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::reset
              ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               &this->longStats,
               (pointer)uVar3._M_t.
                        super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                        .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    this->nBestSeenHeight = uVar5;
    this->historicalFirst = uVar6;
    this->historicalBest = uVar7;
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              (&fileLongStats);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              (&fileShortStats);
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::~unique_ptr
              (&fileFeeStats);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&log_msg);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
LAB_007c38d4:
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Read(AutoFile& filein)
{
    try {
        LOCK(m_cs_fee_estimator);
        int nVersionRequired, nVersionThatWrote;
        filein >> nVersionRequired >> nVersionThatWrote;
        if (nVersionRequired > CLIENT_VERSION) {
            throw std::runtime_error(strprintf("up-version (%d) fee estimate file", nVersionRequired));
        }

        // Read fee estimates file into temporary variables so existing data
        // structures aren't corrupted if there is an exception.
        unsigned int nFileBestSeenHeight;
        filein >> nFileBestSeenHeight;

        if (nVersionRequired < 149900) {
            LogPrintf("%s: incompatible old fee estimation data (non-fatal). Version: %d\n", __func__, nVersionRequired);
        } else { // New format introduced in 149900
            unsigned int nFileHistoricalFirst, nFileHistoricalBest;
            filein >> nFileHistoricalFirst >> nFileHistoricalBest;
            if (nFileHistoricalFirst > nFileHistoricalBest || nFileHistoricalBest > nFileBestSeenHeight) {
                throw std::runtime_error("Corrupt estimates file. Historical block range for estimates is invalid");
            }
            std::vector<double> fileBuckets;
            filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(fileBuckets);
            size_t numBuckets = fileBuckets.size();
            if (numBuckets <= 1 || numBuckets > 1000) {
                throw std::runtime_error("Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
            }

            std::unique_ptr<TxConfirmStats> fileFeeStats(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
            std::unique_ptr<TxConfirmStats> fileShortStats(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
            std::unique_ptr<TxConfirmStats> fileLongStats(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));
            fileFeeStats->Read(filein, nVersionThatWrote, numBuckets);
            fileShortStats->Read(filein, nVersionThatWrote, numBuckets);
            fileLongStats->Read(filein, nVersionThatWrote, numBuckets);

            // Fee estimates file parsed correctly
            // Copy buckets from file and refresh our bucketmap
            buckets = fileBuckets;
            bucketMap.clear();
            for (unsigned int i = 0; i < buckets.size(); i++) {
                bucketMap[buckets[i]] = i;
            }

            // Destroy old TxConfirmStats and point to new ones that already reference buckets and bucketMap
            feeStats = std::move(fileFeeStats);
            shortStats = std::move(fileShortStats);
            longStats = std::move(fileLongStats);

            nBestSeenHeight = nFileBestSeenHeight;
            historicalFirst = nFileHistoricalFirst;
            historicalBest = nFileHistoricalBest;
        }
    }
    catch (const std::exception& e) {
        LogPrintf("CBlockPolicyEstimator::Read(): unable to read policy estimator data (non-fatal): %s\n",e.what());
        return false;
    }
    return true;
}